

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptNativeArray::PopWithNoDst(ScriptContext *scriptContext,Var nativeArray)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  JavascriptArray *arr_00;
  uint32 index;
  JavascriptArray *arr;
  Var nativeArray_local;
  ScriptContext *scriptContext_local;
  
  bVar2 = VarIs<Js::JavascriptNativeArray>(nativeArray);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x136e,"(VarIs<JavascriptNativeArray>(nativeArray))",
                                "VarIs<JavascriptNativeArray>(nativeArray)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  arr_00 = VarTo<Js::JavascriptArray>(nativeArray);
  uVar3 = ArrayObject::GetLength(&arr_00->super_ArrayObject);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1372,"(arr->GetLength() != 0)","arr->GetLength() != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = Js::JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr_00,false);
  if (bVar2) {
    Js::JavascriptArray::EntryPopJavascriptArray(scriptContext,arr_00);
  }
  else {
    uVar3 = ArrayObject::GetLength(&arr_00->super_ArrayObject);
    Js::JavascriptArray::SetLength(arr_00,uVar3 - 1);
  }
  return;
}

Assistant:

void JavascriptNativeArray::PopWithNoDst(ScriptContext* scriptContext, Var nativeArray)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_NativePopWithNoDst);
        Assert(VarIs<JavascriptNativeArray>(nativeArray));
        JavascriptArray * arr = VarTo<JavascriptArray>(nativeArray);

        // we will bailout on length 0
        Assert(arr->GetLength() != 0);

        // Check for SparseArray and also has array in prototype chain
        if (JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr, false)) {
            // Pop (walk chain) and discard the result
            EntryPopJavascriptArray(scriptContext, arr);
            return;
        }

        uint32 index = arr->GetLength() - 1;
        arr->SetLength(index);
        JIT_HELPER_END(Array_NativePopWithNoDst);
    }